

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack24_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[1] - base >> 8;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x10000 | uVar2;
  uVar2 = in[2] - base >> 0x10;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x100 | uVar2;
  uVar1 = in[4];
  out[3] = uVar1 - base;
  out[3] = (in[5] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[5] - base >> 8;
  out[4] = uVar2;
  out[4] = (in[6] - base) * 0x10000 | uVar2;
  uVar2 = in[6] - base >> 0x10;
  out[5] = uVar2;
  out[5] = (in[7] - base) * 0x100 | uVar2;
  uVar1 = in[8];
  out[6] = uVar1 - base;
  out[6] = (in[9] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[9] - base >> 8;
  out[7] = uVar2;
  out[7] = (in[10] - base) * 0x10000 | uVar2;
  uVar2 = in[10] - base >> 0x10;
  out[8] = uVar2;
  out[8] = (in[0xb] - base) * 0x100 | uVar2;
  uVar1 = in[0xc];
  out[9] = uVar1 - base;
  out[9] = (in[0xd] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[0xd] - base >> 8;
  out[10] = uVar2;
  out[10] = (in[0xe] - base) * 0x10000 | uVar2;
  uVar2 = in[0xe] - base >> 0x10;
  out[0xb] = uVar2;
  out[0xb] = (in[0xf] - base) * 0x100 | uVar2;
  uVar1 = in[0x10];
  out[0xc] = uVar1 - base;
  out[0xc] = (in[0x11] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[0x11] - base >> 8;
  out[0xd] = uVar2;
  out[0xd] = (in[0x12] - base) * 0x10000 | uVar2;
  uVar2 = in[0x12] - base >> 0x10;
  out[0xe] = uVar2;
  out[0xe] = (in[0x13] - base) * 0x100 | uVar2;
  uVar1 = in[0x14];
  out[0xf] = uVar1 - base;
  out[0xf] = (in[0x15] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[0x15] - base >> 8;
  out[0x10] = uVar2;
  out[0x10] = (in[0x16] - base) * 0x10000 | uVar2;
  uVar2 = in[0x16] - base >> 0x10;
  out[0x11] = uVar2;
  out[0x11] = (in[0x17] - base) * 0x100 | uVar2;
  uVar1 = in[0x18];
  out[0x12] = uVar1 - base;
  out[0x12] = (in[0x19] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[0x19] - base >> 8;
  out[0x13] = uVar2;
  out[0x13] = (in[0x1a] - base) * 0x10000 | uVar2;
  uVar2 = in[0x1a] - base >> 0x10;
  out[0x14] = uVar2;
  out[0x14] = (in[0x1b] - base) * 0x100 | uVar2;
  uVar1 = in[0x1c];
  out[0x15] = uVar1 - base;
  out[0x15] = (in[0x1d] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[0x1d] - base >> 8;
  out[0x16] = uVar2;
  out[0x16] = (in[0x1e] - base) * 0x10000 | uVar2;
  uVar2 = in[0x1e] - base >> 0x10;
  out[0x17] = uVar2;
  out[0x17] = (in[0x1f] - base) * 0x100 | uVar2;
  return out + 0x18;
}

Assistant:

uint32_t * pack24_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;

    return out;
}